

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O0

sequence<acto::core::worker_t> __thiscall
acto::intrusive::mpsc_stack<acto::core::worker_t>::extract(mpsc_stack<acto::core::worker_t> *this)

{
  bool bVar1;
  atomic<acto::core::worker_t_*> *in_RSI;
  __pointer_type local_20;
  worker_t *top;
  mpsc_stack<acto::core::worker_t> *this_local;
  
  this_local = this;
  do {
    local_20 = std::atomic<acto::core::worker_t_*>::load(in_RSI,relaxed);
    if (local_20 == (__pointer_type)0x0) {
      sequence<acto::core::worker_t>::sequence
                ((sequence<acto::core::worker_t> *)this,(worker_t *)0x0);
      return (sequence<acto::core::worker_t>)(worker_t *)this;
    }
    bVar1 = std::atomic<acto::core::worker_t_*>::compare_exchange_weak
                      (in_RSI,&local_20,(__pointer_type)0x0,seq_cst);
  } while (!bVar1);
  sequence<acto::core::worker_t>::sequence((sequence<acto::core::worker_t> *)this,local_20);
  return (sequence<acto::core::worker_t>)(worker_t *)this;
}

Assistant:

sequence<T> extract() noexcept {
    do {
      T* top = head_.load(std::memory_order_relaxed);

      if (top == nullptr) {
        return sequence<T>{nullptr};
      }
      if (head_.compare_exchange_weak(top, nullptr)) {
        return sequence<T>{top};
      }
    } while (true);
  }